

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cpp
# Opt level: O0

Logging * Logging::getInstance(void)

{
  Logging *pLVar1;
  Logging *in_stack_00000050;
  
  if (instance == (Logging *)0x0) {
    pLVar1 = (Logging *)operator_new(0xe0);
    Logging(in_stack_00000050);
    instance = pLVar1;
  }
  return instance;
}

Assistant:

Logging* Logging::getInstance()
{
    if (instance == 0) {
        instance = new Logging();
    }
    return instance;
}